

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O0

int lws_tls_check_cert_lifetime(lws_vhost *v)

{
  int iVar1;
  unsigned_long uVar2;
  undefined1 auStack_d0 [4];
  int n;
  lws_tls_cert_info_results ir;
  lws_acme_cert_aging_args caa;
  time_t life;
  time_t now;
  lws_vhost *v_local;
  
  uVar2 = lws_now_secs();
  caa.element_overrides[10] = (char *)0x0;
  if (((v->tls).ssl_ctx == (lws_tls_ctx *)0x0) || (((byte)(v->tls).field_0x6c >> 1 & 1) != 0)) {
    _lws_log(8,"   vhost %s: no cert\n",v->name);
  }
  else {
    if ((long)uVar2 < 0x5bf74cc2) {
      return -1;
    }
    iVar1 = lws_tls_vhost_cert_info
                      (v,LWS_TLS_CERT_INFO_VALIDITY_TO,(lws_tls_cert_info_results *)auStack_d0,0);
    if (iVar1 != 0) {
      return 1;
    }
    caa.element_overrides[10] = (char *)((long)(_auStack_d0 - uVar2) / 0x15180);
    _lws_log(4,"   vhost %s: cert expiry: %dd\n",v->name,
             (ulong)caa.element_overrides[10] & 0xffffffff);
  }
  memset(ir.ns.name + 0x3c,0,0x60);
  ir._64_8_ = v;
  lws_broadcast(v->context->pt,0x48,ir.ns.name + 0x3c,(size_t)caa.element_overrides[10]);
  return 0;
}

Assistant:

int
lws_tls_check_cert_lifetime(struct lws_vhost *v)
{
	time_t now = (time_t)lws_now_secs(), life = 0;
	struct lws_acme_cert_aging_args caa;
	union lws_tls_cert_info_results ir;
	int n;

	if (v->tls.ssl_ctx && !v->tls.skipped_certs) {

		if (now < 1542933698) /* Nov 23 2018 00:42 UTC */
			/* our clock is wrong and we can't judge the certs */
			return -1;

		n = lws_tls_vhost_cert_info(v, LWS_TLS_CERT_INFO_VALIDITY_TO,
					    &ir, 0);
		if (n)
			return 1;

		life = (ir.time - now) / (24 * 3600);
		lwsl_notice("   vhost %s: cert expiry: %dd\n", v->name,
			    (int)life);
	} else
		lwsl_info("   vhost %s: no cert\n", v->name);

	memset(&caa, 0, sizeof(caa));
	caa.vh = v;
	lws_broadcast(&v->context->pt[0], LWS_CALLBACK_VHOST_CERT_AGING, (void *)&caa,
		      (size_t)(ssize_t)life);

	return 0;
}